

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O2

vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
* __thiscall
helics::FilterOperator::processVector
          (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           *__return_storage_ptr__,FilterOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> res;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_28;
  _Head_base<0UL,_helics::Message_*,_false> local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20._M_head_impl =
       (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
       ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
  (*this->_vptr_FilterOperator[2])(&local_28,this,&local_20);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_20);
  if (local_28._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)0x0) {
    std::
    vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
    ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
              ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                *)__return_storage_ptr__,
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_28);
  }
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::unique_ptr<Message>> processVector(std::unique_ptr<Message> message)
    {
        std::vector<std::unique_ptr<Message>> ret;
        auto res = process(std::move(message));
        if (res) {
            ret.push_back(std::move(res));
        }
        return ret;
    }